

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_strfilter(char *text,char *regexp)

{
  char cVar1;
  int iVar2;
  
  if (*regexp == '^') {
    iVar2 = nk_str_match_here(regexp + 1,text);
    return iVar2;
  }
  do {
    iVar2 = nk_str_match_here(regexp,text);
    if (iVar2 != 0) {
      return 1;
    }
    cVar1 = *text;
    text = text + 1;
  } while (cVar1 != '\0');
  return 0;
}

Assistant:

NK_API int
nk_strfilter(const char *text, const char *regexp)
{
    /*
    c    matches any literal character c
    .    matches any single character
    ^    matches the beginning of the input string
    $    matches the end of the input string
    *    matches zero or more occurrences of the previous character*/
    if (regexp[0] == '^')
        return nk_str_match_here(regexp+1, text);
    do {    /* must look even if string is empty */
        if (nk_str_match_here(regexp, text))
            return 1;
    } while (*text++ != '\0');
    return 0;
}